

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::Triangle::computeNormal(Vector3d *__return_storage_ptr__,Triangle *this)

{
  Vector<double,_3U> local_30;
  
  this->HaveNormal_ = true;
  cross<double>((Vector3<double> *)&local_30,&this->a_,&this->b_);
  Vector<double,_3U>::operator=(&(this->normal_).super_Vector<double,_3U>,&local_30);
  Vector<double,_3U>::Vector
            (&__return_storage_ptr__->super_Vector<double,_3U>,
             &(this->normal_).super_Vector<double,_3U>);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Triangle::computeNormal() {
  HaveNormal_ = true;
  normal_     = cross(a_, b_);
  return normal_;
}